

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O1

void nn_queue_push(nn_queue *self,nn_queue_item *item)

{
  nn_queue *pnVar1;
  nn_queue *pnVar2;
  nn_queue *pnVar3;
  
  if (item->next == (nn_queue_item *)0xffffffffffffffff) {
    item->next = (nn_queue_item *)0x0;
    if (self->head == (nn_queue_item *)0x0) {
      self->head = item;
    }
    if (self->tail != (nn_queue_item *)0x0) {
      self->tail->next = item;
    }
    self->tail = item;
    return;
  }
  nn_queue_push_cold_1();
  if (((nn_queue *)item)->head != (nn_queue_item *)0xffffffffffffffff) {
    pnVar2 = self;
    pnVar1 = (nn_queue *)0x0;
    do {
      pnVar3 = pnVar1;
      pnVar2 = (nn_queue *)pnVar2->head;
      if (pnVar2 == (nn_queue *)0x0) {
        return;
      }
      pnVar1 = pnVar2;
    } while (pnVar2 != (nn_queue *)item);
    if ((nn_queue *)self->head == pnVar2) {
      self->head = pnVar2->head;
    }
    if ((nn_queue *)self->tail == pnVar2) {
      self->tail = (nn_queue_item *)pnVar3;
    }
    if (pnVar3 != (nn_queue *)0x0) {
      pnVar3->head = pnVar2->head;
    }
    ((nn_queue *)item)->head = (nn_queue_item *)0xffffffffffffffff;
  }
  return;
}

Assistant:

void nn_queue_push (struct nn_queue *self, struct nn_queue_item *item)
{
    nn_assert (item->next == NN_QUEUE_NOTINQUEUE);

    item->next = NULL;
    if (!self->head)
        self->head = item;
    if (self->tail)
        self->tail->next = item;
    self->tail = item;
}